

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void __thiscall Catch::Session::useConfigData(Session *this,ConfigData *configData)

{
  ConfigData *configData_local;
  Session *this_local;
  
  ConfigData::operator=(&this->m_configData,configData);
  Detail::unique_ptr<Catch::Config>::reset(&this->m_config,(Config *)0x0);
  return;
}

Assistant:

void Session::useConfigData( ConfigData const& configData ) {
        m_configData = configData;
        m_config.reset();
    }